

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

int __thiscall
array<CSkins::CSkinPart,_allocator_default<CSkins::CSkinPart>_>::insert
          (array<CSkins::CSkinPart,_allocator_default<CSkins::CSkinPart>_> *this,CSkinPart *item,
          range r)

{
  long lVar1;
  int iVar2;
  CSkinPart *pCVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  CSkinPart *pCVar9;
  long lVar10;
  long in_FS_OFFSET;
  byte bVar11;
  range r_local;
  
  r_local.end = r.end;
  r_local.begin = r.begin;
  bVar11 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (r_local.begin < r_local.end) {
    pCVar3 = plain_range<CSkins::CSkinPart>::front(&r_local);
    pCVar9 = this->list;
    incsize(this);
    set_size(this,this->num_elements + 1);
    lVar6 = (long)this->num_elements;
    iVar2 = (int)(((long)pCVar3 - (long)pCVar9) / 0x7c);
    lVar5 = lVar6 * 0x7c;
    while( true ) {
      lVar6 = lVar6 + -1;
      lVar10 = lVar5 + -0x7c;
      pCVar9 = this->list;
      if (lVar6 <= iVar2) break;
      pcVar7 = pCVar9[-2].m_aName + lVar5 + -4;
      pcVar8 = pCVar9[-1].m_aName + lVar5 + -4;
      for (lVar4 = 0x1f; lVar5 = lVar10, lVar4 != 0; lVar4 = lVar4 + -1) {
        *(undefined4 *)pcVar8 = *(undefined4 *)pcVar7;
        pcVar7 = pcVar7 + ((ulong)bVar11 * -2 + 1) * 4;
        pcVar8 = pcVar8 + ((ulong)bVar11 * -2 + 1) * 4;
      }
    }
    pCVar9 = pCVar9 + iVar2;
    for (lVar5 = 0x1f; lVar5 != 0; lVar5 = lVar5 + -1) {
      pCVar9->m_Flags = item->m_Flags;
      item = (CSkinPart *)((long)item + (ulong)bVar11 * -8 + 4);
      pCVar9 = (CSkinPart *)((long)pCVar9 + ((ulong)bVar11 * -2 + 1) * 4);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return this->num_elements + -1;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    iVar2 = add(this,item);
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int insert(const T& item, range r)
	{
		if(r.empty())
			return add(item);

		int index = (int)(&r.front()-list);
		incsize();
		set_size(size()+1);

		for(int i = num_elements-1; i > index; i--)
			list[i] = list[i-1];

		list[index] = item;

		return num_elements-1;
	}